

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_env(App *this)

{
  bool bVar1;
  element_type *this_00;
  size_t sVar2;
  Option *in_RDI;
  App_p *sub;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1_1;
  string result;
  string ename_string;
  Option_p *opt;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range1;
  pointer in_stack_ffffffffffffff18;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  App *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  Option *in_stack_ffffffffffffffa8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_18;
  App *this_01;
  
  this_01 = (App *)&(in_RDI->description_).field_2;
  local_18._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       std::
       vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ::begin((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                *)in_stack_ffffffffffffff18);
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::end((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         *)in_stack_ffffffffffffff18);
  while (bVar1 = __gnu_cxx::
                 operator==<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                           ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                             *)in_stack_ffffffffffffff18), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator*(&local_18);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1e2396);
    sVar2 = Option::count((Option *)0x1e239e);
    if (sVar2 == 0) {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1e23b5);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1e23c4);
      if (!bVar1) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1e23d9);
        CLI::detail::get_environment_value(in_stack_ffffffffffffff78);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e23fd)
        ;
        if (!bVar1) {
          ::std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                    ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1e2429);
          Option::_validate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff9c);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1e246b);
          if (bVar1) {
            in_stack_ffffffffffffff18 =
                 std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1e247e);
            ::std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            Option::add_result(in_RDI,(string *)in_stack_ffffffffffffff18);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          }
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        }
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&local_18);
  }
  local_c0 = &in_RDI[1].fnames_;
  local_c8._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                  in_stack_ffffffffffffff18);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
            ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             in_stack_ffffffffffffff18);
  do {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                      ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)in_stack_ffffffffffffff18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator*(&local_c8);
    this_00 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x1e25a0);
    get_name_abi_cxx11_(this_00);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e25b0
                      );
    if (bVar1) {
LAB_001e25e6:
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1e25f0
                );
      _process_env(this_01);
    }
    else {
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1e25be
                );
      sVar2 = count_all(in_stack_ffffffffffffff60);
      if (sVar2 != 0) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1e25d6);
        bVar1 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1e25e2);
        if (!bVar1) goto LAB_001e25e6;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_c8);
  } while( true );
}

Assistant:

CLI11_INLINE void App::_process_env() {
    for(const Option_p &opt : options_) {
        if(opt->count() == 0 && !opt->envname_.empty()) {
            std::string ename_string = detail::get_environment_value(opt->envname_);
            if(!ename_string.empty()) {
                std::string result = ename_string;
                result = opt->_validate(result, 0);
                if(result.empty()) {
                    opt->add_result(ename_string);
                }
            }
        }
    }

    for(App_p &sub : subcommands_) {
        if(sub->get_name().empty() || (sub->count_all() > 0 && !sub->parse_complete_callback_)) {
            // only process environment variables if the callback has actually been triggered already
            sub->_process_env();
        }
    }
}